

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall icu_63::Calendar::setMinimalDaysInFirstWeek(Calendar *this,uint8_t value)

{
  uint8_t uVar1;
  int iVar2;
  undefined3 in_register_00000031;
  
  iVar2 = 7;
  if (value < 7) {
    iVar2 = CONCAT31(in_register_00000031,value);
  }
  uVar1 = '\x01';
  if (CONCAT31(in_register_00000031,value) != 0) {
    uVar1 = (uint8_t)iVar2;
  }
  if (this->fMinimalDaysInFirstWeek != uVar1) {
    this->fMinimalDaysInFirstWeek = uVar1;
    this->fAreFieldsSet = '\0';
  }
  return;
}

Assistant:

void
Calendar::setMinimalDaysInFirstWeek(uint8_t value)
{
    // Values less than 1 have the same effect as 1; values greater
    // than 7 have the same effect as 7. However, we normalize values
    // so operator== and so forth work.
    if (value < 1) {
        value = 1;
    } else if (value > 7) {
        value = 7;
    }
    if (fMinimalDaysInFirstWeek != value) {
        fMinimalDaysInFirstWeek = value;
        fAreFieldsSet = FALSE;
    }
}